

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O1

FT_Error ft_stroker_arcto(FT_Stroker stroker,FT_Int side)

{
  long angle;
  FT_Fixed length;
  FT_Error FVar1;
  ulong uVar2;
  long lVar3;
  FT_Fixed FVar4;
  FT_Fixed FVar5;
  FT_Long length_00;
  ulong uVar6;
  long angle_00;
  ulong uVar7;
  undefined1 local_a0 [8];
  FT_Vector a2;
  undefined1 auStack_58 [8];
  FT_Vector a;
  undefined1 auStack_40 [8];
  FT_Vector b;
  
  length = stroker->radius;
  uVar7 = (ulong)(uint)side;
  uVar2 = FT_Angle_Diff(stroker->angle_in,stroker->angle_out);
  uVar6 = uVar7 * 0x1680000 - 0xb40000;
  if (uVar2 != 0xb40000) {
    uVar6 = uVar2;
  }
  a.y = (FT_Pos)(stroker->borders + uVar7);
  angle_00 = uVar7 * -0xb40000 + stroker->angle_in + 0x5a0000;
  FT_Vector_From_Polar((FT_Vector *)auStack_58,length,angle_00);
  auStack_58 = (undefined1  [8])((long)auStack_58 + (stroker->center).x);
  a.x = a.x + (stroker->center).y;
  FVar1 = 0;
  lVar3 = -0x5a0000;
  if (-1 < (long)uVar6) {
    lVar3 = 0x5a0000;
  }
  if (uVar6 != 0) {
    do {
      uVar2 = 0xffffffffffa60000;
      if (-0x5a0000 < (long)uVar6) {
        uVar2 = uVar6;
      }
      if (0x59ffff < (long)uVar2) {
        uVar2 = 0x5a0000;
      }
      angle = angle_00 + uVar2;
      uVar7 = -uVar2;
      if (0 < (long)uVar2) {
        uVar7 = uVar2;
      }
      uVar7 = uVar7 >> 1 & 0x7fffffff;
      FT_Vector_From_Polar((FT_Vector *)auStack_40,length,angle);
      auStack_40 = (undefined1  [8])((long)auStack_40 + (stroker->center).x);
      b.x = b.x + (stroker->center).y;
      FVar4 = FT_Sin(uVar7);
      FVar5 = FT_Cos(uVar7);
      length_00 = FT_MulDiv(length,FVar4 * 4,FVar5 * 3 + 0x30000);
      FT_Vector_From_Polar((FT_Vector *)local_a0,length_00,angle_00 + lVar3);
      local_a0 = (undefined1  [8])((long)local_a0 + (long)auStack_58);
      a2.x = a2.x + a.x;
      FT_Vector_From_Polar((FT_Vector *)&a2.y,length_00,angle - lVar3);
      a2.y = a2.y + (long)auStack_40;
      FVar1 = ft_stroke_border_cubicto
                        ((FT_StrokeBorder)a.y,(FT_Vector *)local_a0,(FT_Vector *)&a2.y,
                         (FT_Vector *)auStack_40);
      if (FVar1 != 0) goto LAB_001f6f3c;
      auStack_58 = auStack_40;
      a.x = b.x;
      uVar6 = uVar6 - uVar2;
      angle_00 = angle;
    } while (uVar6 != 0);
    FVar1 = 0;
  }
LAB_001f6f3c:
  *(undefined1 *)(a.y + 0x18) = 0;
  return FVar1;
}

Assistant:

static FT_Error
  ft_stroker_arcto( FT_Stroker  stroker,
                    FT_Int      side )
  {
    FT_Angle         total, rotate;
    FT_Fixed         radius = stroker->radius;
    FT_Error         error  = FT_Err_Ok;
    FT_StrokeBorder  border = stroker->borders + side;


    rotate = FT_SIDE_TO_ROTATE( side );

    total = FT_Angle_Diff( stroker->angle_in, stroker->angle_out );
    if ( total == FT_ANGLE_PI )
      total = -rotate * 2;

    error = ft_stroke_border_arcto( border,
                                    &stroker->center,
                                    radius,
                                    stroker->angle_in + rotate,
                                    total );
    border->movable = FALSE;
    return error;
  }